

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void Gudhi::persistence_matrix::swap
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *col1,Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                      *col2)

{
  Index IVar1;
  Dimension DVar2;
  ID_index IVar3;
  Index IVar4;
  Row_container *pRVar5;
  Field_operators *pFVar6;
  Entry_constructor *pEVar7;
  
  pRVar5 = (col1->super_Row_access_option).rows_;
  (col1->super_Row_access_option).rows_ = (col2->super_Row_access_option).rows_;
  (col2->super_Row_access_option).rows_ = pRVar5;
  IVar1 = (col1->super_Row_access_option).columnIndex_;
  (col1->super_Row_access_option).columnIndex_ = (col2->super_Row_access_option).columnIndex_;
  (col2->super_Row_access_option).columnIndex_ = IVar1;
  DVar2 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar2;
  IVar3 = (col1->super_Chain_column_option).pivot_;
  (col1->super_Chain_column_option).pivot_ = (col2->super_Chain_column_option).pivot_;
  (col2->super_Chain_column_option).pivot_ = IVar3;
  IVar4 = (col1->super_Chain_column_option).pairedColumn_;
  (col1->super_Chain_column_option).pairedColumn_ = (col2->super_Chain_column_option).pairedColumn_;
  (col2->super_Chain_column_option).pairedColumn_ = IVar4;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&col1->column_,(node_ptr)&col2->column_);
  pFVar6 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar6;
  pEVar7 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar7;
  return;
}

Assistant:

void swap(Intrusive_list_column& col1, Intrusive_list_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }